

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestLoader.cpp
# Opt level: O1

void __thiscall
llbuild::ninja::ManifestLoader::ManifestLoaderImpl::actOnDefaultDecl
          (ManifestLoaderImpl *this,ArrayRef<llbuild::ninja::Token> nameToks)

{
  pointer *pppNVar1;
  Manifest *pMVar2;
  iterator __position;
  Token *nameTok;
  Token *pTVar3;
  long lVar4;
  StringRef path0;
  Node *node;
  Node *local_30;
  
  pTVar3 = nameToks.Data;
  if (nameToks.Length != 0) {
    lVar4 = nameToks.Length * 0x18;
    do {
      path0.Length._0_4_ = pTVar3->length;
      path0.Data = pTVar3->start;
      path0.Length._4_4_ = 0;
      local_30 = Manifest::findNode((this->manifest)._M_t.
                                    super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                                    .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>.
                                    _M_head_impl,this->workingDirectory,path0);
      if (local_30 == (Node *)0x0) {
        (*(this->super_ParseActions)._vptr_ParseActions[2])(this,"unknown target name",0x13,pTVar3);
      }
      else {
        pMVar2 = (this->manifest)._M_t.
                 super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
                 .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl;
        __position._M_current =
             (pMVar2->defaultTargets).
             super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pMVar2->defaultTargets).
            super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>>::
          _M_realloc_insert<llbuild::ninja::Node*const&>
                    ((vector<llbuild::ninja::Node*,std::allocator<llbuild::ninja::Node*>> *)
                     &pMVar2->defaultTargets,__position,&local_30);
        }
        else {
          *__position._M_current = local_30;
          pppNVar1 = &(pMVar2->defaultTargets).
                      super__Vector_base<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
      }
      pTVar3 = pTVar3 + 1;
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

virtual void actOnDefaultDecl(ArrayRef<Token> nameToks) override {
    // Resolve all of the inputs and outputs.
    for (const auto& nameTok: nameToks) {
      StringRef name(nameTok.start, nameTok.length);
      Node* node = manifest->findNode(workingDirectory, name);

      if (node == nullptr) {
        error("unknown target name", nameTok);
        continue;
      }

      manifest->getDefaultTargets().push_back(node);
    }
  }